

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O1

wchar_t zip_read_local_file_header(archive_read *a,archive_entry *entry,zip *zip)

{
  int64_t *piVar1;
  byte bVar2;
  uint32_t uVar3;
  zip_entry *zip_entry;
  long lVar4;
  uint16_t uVar5;
  wchar_t wVar6;
  unsigned_long uVar7;
  archive_string_conv *paVar8;
  int *piVar9;
  time_t tVar10;
  wchar_t *pwVar11;
  size_t sVar12;
  wchar_t *pwVar13;
  int64_t iVar14;
  long lVar15;
  char *pcVar16;
  uchar *puVar17;
  size_t sVar18;
  ulong min;
  int iVar19;
  int error_number;
  ulong min_00;
  archive_string_conv **ppaVar20;
  bool bVar21;
  wchar_t local_70;
  archive_wstring local_48;
  
  zip_entry = zip->entry;
  lVar15 = zip_entry->compressed_size;
  lVar4 = zip_entry->uncompressed_size;
  uVar3 = zip_entry->cm_zlib_crc32;
  zip->decompress_init = '\0';
  zip->end_of_entry = '\0';
  zip->entry_compressed_bytes_read = 0;
  zip->entry_uncompressed_bytes_read = 0;
  uVar7 = (*zip->crc32func)(0,(void *)0x0,0);
  zip->entry_crc32 = uVar7;
  if ((zip->sconv == (archive_string_conv *)0x0) && (zip->init_default_conversion == 0)) {
    paVar8 = archive_string_default_conversion_for_read(&a->archive);
    zip->sconv_default = paVar8;
    zip->init_default_conversion = 1;
  }
  piVar9 = (int *)__archive_read_ahead(a,0x1e,(ssize_t *)0x0);
  if (piVar9 == (int *)0x0) {
LAB_0046f024:
    pcVar16 = "Truncated ZIP file header";
    iVar19 = 0x54;
LAB_0046f033:
    archive_set_error(&a->archive,iVar19,pcVar16);
    return L'\xffffffe2';
  }
  if (*piVar9 != 0x4034b50) {
    pcVar16 = "Damaged Zip archive";
    iVar19 = -1;
    goto LAB_0046f033;
  }
  iVar19 = piVar9[1];
  zip_entry->system = *(uchar *)((long)piVar9 + 5);
  bVar2 = *(byte *)((long)piVar9 + 6);
  zip_entry->zip_flags = *(uint16_t *)((long)piVar9 + 6);
  if ((bVar2 & 0x41) != 0) {
    zip->has_encrypted_entries = 1;
    archive_entry_set_is_data_encrypted(entry,'\x01');
    if ((~zip_entry->zip_flags & 0x2041) == 0) {
      archive_entry_set_is_metadata_encrypted(entry,'\x01');
      return L'\xffffffe2';
    }
  }
  zip->init_decryption = (byte)zip_entry->zip_flags & 1;
  zip_entry->compression = (uchar)piVar9[2];
  tVar10 = zip_time((char *)((long)piVar9 + 10));
  zip_entry->mtime = tVar10;
  zip_entry->cm_zlib_crc32 = *(uint32_t *)((long)piVar9 + 0xe);
  puVar17 = (uchar *)((long)piVar9 + 0x11);
  if ((zip_entry->zip_flags & 8) != 0) {
    puVar17 = (uchar *)((long)piVar9 + 0xb);
  }
  zip_entry->decdat = *puVar17;
  zip_entry->compressed_size = (ulong)*(uint *)((long)piVar9 + 0x12);
  zip_entry->uncompressed_size = (ulong)*(uint *)((long)piVar9 + 0x16);
  min = (ulong)*(ushort *)((long)piVar9 + 0x1a);
  min_00 = (ulong)*(ushort *)(piVar9 + 7);
  __archive_read_consume(a,0x1e);
  pcVar16 = (char *)__archive_read_ahead(a,min,(ssize_t *)0x0);
  if (pcVar16 == (char *)0x0) goto LAB_0046f024;
  if ((zip_entry->zip_flags & 0x800) == 0) {
    paVar8 = zip->sconv;
    if (paVar8 == (archive_string_conv *)0x0) {
      ppaVar20 = &zip->sconv_default;
      goto LAB_0046eee6;
    }
  }
  else {
    ppaVar20 = &zip->sconv_utf8;
    if (zip->sconv_utf8 == (archive_string_conv *)0x0) {
      paVar8 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
      *ppaVar20 = paVar8;
      if (paVar8 == (archive_string_conv *)0x0) {
        return L'\xffffffe2';
      }
    }
LAB_0046eee6:
    paVar8 = *ppaVar20;
  }
  wVar6 = _archive_entry_copy_pathname_l(entry,pcVar16,min,paVar8);
  if (wVar6 == L'\0') {
    local_70 = L'\0';
  }
  else {
    piVar9 = __errno_location();
    if (*piVar9 == 0xc) {
      pcVar16 = "Can\'t allocate memory for Pathname";
      iVar19 = 0xc;
      goto LAB_0046f033;
    }
    pcVar16 = archive_string_conversion_charset_name(paVar8);
    archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                      pcVar16);
    local_70 = L'\xffffffec';
  }
  __archive_read_consume(a,min);
  pcVar16 = (char *)__archive_read_ahead(a,min_00,(ssize_t *)0x0);
  if (pcVar16 == (char *)0x0) goto LAB_0046f024;
  wVar6 = process_extra(a,pcVar16,min_00,zip_entry);
  if (wVar6 != L'\0') {
    return L'\xffffffe2';
  }
  __archive_read_consume(a,min_00);
  if ((zip_entry->mode & 0xf000) == 0x1000) {
    zip_entry->mode = zip_entry->mode & 0xfff | 0x8000;
  }
  if (zip_entry->mode == 0) {
    zip_entry->mode = 0x1b4;
  }
  if ((((zip_entry->system == '\0') &&
       (pwVar11 = archive_entry_pathname_w(entry), pwVar11 != (wchar_t *)0x0)) &&
      (pwVar13 = wcschr(pwVar11,L'/'), pwVar13 == (wchar_t *)0x0)) &&
     (pwVar13 = wcschr(pwVar11,L'\\'), pwVar13 != (wchar_t *)0x0)) {
    local_48.s = (wchar_t *)0x0;
    local_48.length = 0;
    local_48.buffer_length = 0;
    sVar12 = wcslen(pwVar11);
    archive_wstrncat(&local_48,pwVar11,sVar12);
    if (local_48.length != 0) {
      sVar18 = 0;
      do {
        if (local_48.s[sVar18] == L'\\') {
          local_48.s[sVar18] = L'/';
        }
        sVar18 = sVar18 + 1;
      } while (local_48.length != sVar18);
    }
    archive_entry_copy_pathname_w(entry,local_48.s);
    archive_wstring_free(&local_48);
  }
  if ((zip_entry->mode & 0xf000) != 0x4000) {
    pwVar11 = archive_entry_pathname_w(entry);
    if (pwVar11 == (wchar_t *)0x0) {
      pcVar16 = archive_entry_pathname(entry);
      if (pcVar16 == (char *)0x0) {
        sVar12 = 0;
      }
      else {
        sVar12 = strlen(pcVar16);
      }
      if (sVar12 != 0) {
        bVar21 = pcVar16[sVar12 - 1] == '/';
        goto LAB_0046f127;
      }
LAB_0046f13f:
      if (0xfff < zip_entry->mode) goto LAB_0046f155;
      uVar5 = zip_entry->mode | 0x8000;
    }
    else {
      sVar12 = wcslen(pwVar11);
      if (sVar12 == 0) goto LAB_0046f13f;
      bVar21 = pwVar11[sVar12 - 1] == L'/';
LAB_0046f127:
      if (!bVar21) goto LAB_0046f13f;
      uVar5 = zip_entry->mode & 0xfb6 | 0x4049;
    }
    zip_entry->mode = uVar5;
  }
LAB_0046f155:
  if ((zip_entry->mode & 0xf000) == 0x4000) {
    pwVar11 = archive_entry_pathname_w(entry);
    if (pwVar11 == (wchar_t *)0x0) {
      pcVar16 = archive_entry_pathname(entry);
      if (pcVar16 == (char *)0x0) {
        sVar12 = 0;
      }
      else {
        sVar12 = strlen(pcVar16);
      }
      if ((sVar12 != 0) && (pcVar16[sVar12 - 1] != '/')) {
        local_48.s = (wchar_t *)0x0;
        local_48.length = 0;
        local_48.buffer_length = 0;
        archive_strcat((archive_string *)&local_48,pcVar16);
        archive_strappend_char((archive_string *)&local_48,'/');
        archive_entry_set_pathname(entry,(char *)local_48.s);
        archive_string_free((archive_string *)&local_48);
      }
    }
    else {
      sVar12 = wcslen(pwVar11);
      if ((sVar12 != 0) && (pwVar11[sVar12 - 1] != L'/')) {
        local_48.s = (wchar_t *)0x0;
        local_48.length = 0;
        local_48.buffer_length = 0;
        archive_wstrcat(&local_48,pwVar11);
        archive_wstrappend_wchar(&local_48,L'/');
        archive_entry_copy_pathname_w(entry,local_48.s);
        archive_wstring_free(&local_48);
      }
    }
  }
  piVar1 = &zip_entry->compressed_size;
  if ((zip_entry->flags & 2) != 0) {
    *(byte *)&zip_entry->zip_flags = (byte)zip_entry->zip_flags & 0xf7;
    if (zip_entry->cm_zlib_crc32 == 0) {
      zip_entry->cm_zlib_crc32 = uVar3;
    }
    else if (zip_entry->cm_zlib_crc32 != uVar3 && zip->ignore_crc32 == '\0') {
      archive_set_error(&a->archive,0x54,"Inconsistent CRC32 values");
      local_70 = L'\xffffffec';
    }
    if (*piVar1 == 0) {
      *piVar1 = lVar15;
    }
    else if (*piVar1 != lVar15) {
      archive_set_error(&a->archive,0x54,
                        "Inconsistent compressed size: %jd in central directory, %jd in local header"
                       );
      local_70 = L'\xffffffec';
    }
    if (zip_entry->uncompressed_size == 0) {
      zip_entry->uncompressed_size = lVar4;
    }
    else if (zip_entry->uncompressed_size != lVar4) {
      archive_set_error(&a->archive,0x54,
                        "Inconsistent uncompressed size: %jd in central directory, %jd in local header"
                       );
      local_70 = L'\xffffffec';
    }
  }
  archive_entry_set_mode(entry,(uint)zip_entry->mode);
  archive_entry_set_uid(entry,zip_entry->uid);
  archive_entry_set_gid(entry,zip_entry->gid);
  archive_entry_set_mtime(entry,zip_entry->mtime,0);
  archive_entry_set_ctime(entry,zip_entry->ctime,0);
  archive_entry_set_atime(entry,zip_entry->atime,0);
  if ((zip->entry->mode & 0xf000) != 0xa000) {
    if (((zip_entry->zip_flags & 8) == 0) || (0 < zip_entry->uncompressed_size)) {
      archive_entry_set_size(entry,zip_entry->uncompressed_size);
    }
    goto LAB_0046f513;
  }
  sVar18 = *piVar1;
  if ((long)sVar18 < 0x10001) {
    archive_entry_set_size(entry,0);
    pcVar16 = (char *)__archive_read_ahead(a,sVar18,(ssize_t *)0x0);
    if (pcVar16 == (char *)0x0) {
      pcVar16 = "Truncated Zip file";
      goto LAB_0046f4f3;
    }
    paVar8 = zip->sconv;
    if (paVar8 == (archive_string_conv *)0x0) {
      if ((zip->entry->zip_flags & 0x800) == 0) {
        paVar8 = (archive_string_conv *)0x0;
      }
      else {
        paVar8 = zip->sconv_utf8;
      }
    }
    if (paVar8 == (archive_string_conv *)0x0) {
      paVar8 = zip->sconv_default;
    }
    wVar6 = _archive_entry_copy_symlink_l(entry,pcVar16,sVar18,paVar8);
    if (wVar6 != L'\0') {
      piVar9 = __errno_location();
      if (((*piVar9 != 0xc) && (paVar8 == zip->sconv_utf8)) &&
         ((zip->entry->zip_flags & 0x800) != 0)) {
        _archive_entry_copy_symlink_l(entry,pcVar16,sVar18,(archive_string_conv *)0x0);
      }
      if (*piVar9 != 0xc) {
        if ((paVar8 != zip->sconv_utf8) || ((zip->entry->zip_flags & 0x800) == 0)) {
          pcVar16 = archive_string_conversion_charset_name(paVar8);
          archive_set_error(&a->archive,0x54,
                            "Symlink cannot be converted from %s to current locale.",pcVar16);
          local_70 = L'\xffffffec';
        }
        goto LAB_0046f4d1;
      }
      pcVar16 = "Can\'t allocate memory for Symlink";
      error_number = 0xc;
      goto LAB_0046f4fe;
    }
LAB_0046f4d1:
    *piVar1 = 0;
    zip_entry->uncompressed_size = 0;
    iVar14 = __archive_read_consume(a,sVar18);
    bVar21 = true;
    if (iVar14 < 0) {
      pcVar16 = "Read error skipping symlink target name";
      goto LAB_0046f4f3;
    }
  }
  else {
    pcVar16 = "Zip file with oversized link entry";
LAB_0046f4f3:
    error_number = -1;
LAB_0046f4fe:
    bVar21 = false;
    archive_set_error(&a->archive,error_number,pcVar16);
  }
  if (!bVar21) {
    return L'\xffffffe2';
  }
LAB_0046f513:
  lVar15 = zip_entry->compressed_size;
  zip->entry_bytes_remaining = lVar15;
  if (lVar15 < 1 && (zip_entry->zip_flags & 8) == 0) {
    zip->end_of_entry = '\x01';
  }
  (zip->format_name).length = 0;
  lVar15 = 8;
  pcVar16 = "??";
  do {
    if (*(uint *)((long)&PTR_bid_keyword_keys_u_006ae348 + lVar15) == (uint)zip->entry->compression)
    {
      pcVar16 = *(char **)((long)&compression_methods[0].id + lVar15);
      break;
    }
    lVar15 = lVar15 + 0x10;
  } while (lVar15 != 0x178);
  archive_string_sprintf
            (&zip->format_name,"ZIP %d.%d (%s)",(ulong)(uint)((int)(char)iVar19 / 10),
             (ulong)(uint)((int)(char)iVar19 % 10),pcVar16);
  (a->archive).archive_format_name = (zip->format_name).s;
  return local_70;
}

Assistant:

static int
zip_read_local_file_header(struct archive_read *a, struct archive_entry *entry,
    struct zip *zip)
{
	const char *p;
	const void *h;
	const wchar_t *wp;
	const char *cp;
	size_t len, filename_length, extra_length;
	struct archive_string_conv *sconv;
	struct zip_entry *zip_entry = zip->entry;
	struct zip_entry zip_entry_central_dir;
	int ret = ARCHIVE_OK;
	char version;

	/* Save a copy of the original for consistency checks. */
	zip_entry_central_dir = *zip_entry;

	zip->decompress_init = 0;
	zip->end_of_entry = 0;
	zip->entry_uncompressed_bytes_read = 0;
	zip->entry_compressed_bytes_read = 0;
	zip->entry_crc32 = zip->crc32func(0, NULL, 0);

	/* Setup default conversion. */
	if (zip->sconv == NULL && !zip->init_default_conversion) {
		zip->sconv_default =
		    archive_string_default_conversion_for_read(&(a->archive));
		zip->init_default_conversion = 1;
	}

	if ((p = __archive_read_ahead(a, 30, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}

	if (memcmp(p, "PK\003\004", 4) != 0) {
		archive_set_error(&a->archive, -1, "Damaged Zip archive");
		return ARCHIVE_FATAL;
	}
	version = p[4];
	zip_entry->system = p[5];
	zip_entry->zip_flags = archive_le16dec(p + 6);
	if (zip_entry->zip_flags & (ZIP_ENCRYPTED | ZIP_STRONG_ENCRYPTED)) {
		zip->has_encrypted_entries = 1;
		archive_entry_set_is_data_encrypted(entry, 1);
		if (zip_entry->zip_flags & ZIP_CENTRAL_DIRECTORY_ENCRYPTED &&
			zip_entry->zip_flags & ZIP_ENCRYPTED &&
			zip_entry->zip_flags & ZIP_STRONG_ENCRYPTED) {
			archive_entry_set_is_metadata_encrypted(entry, 1);
			return ARCHIVE_FATAL;
		}
	}
	zip->init_decryption = (zip_entry->zip_flags & ZIP_ENCRYPTED);
	zip_entry->compression = (char)archive_le16dec(p + 8);
	zip_entry->mtime = zip_time(p + 10);
	zip_entry->crc32 = archive_le32dec(p + 14);
	if (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
		zip_entry->decdat = p[11];
	else
		zip_entry->decdat = p[17];
	zip_entry->compressed_size = archive_le32dec(p + 18);
	zip_entry->uncompressed_size = archive_le32dec(p + 22);
	filename_length = archive_le16dec(p + 26);
	extra_length = archive_le16dec(p + 28);

	__archive_read_consume(a, 30);

	/* Read the filename. */
	if ((h = __archive_read_ahead(a, filename_length, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}
	if (zip_entry->zip_flags & ZIP_UTF8_NAME) {
		/* The filename is stored to be UTF-8. */
		if (zip->sconv_utf8 == NULL) {
			zip->sconv_utf8 =
			    archive_string_conversion_from_charset(
				&a->archive, "UTF-8", 1);
			if (zip->sconv_utf8 == NULL)
				return (ARCHIVE_FATAL);
		}
		sconv = zip->sconv_utf8;
	} else if (zip->sconv != NULL)
		sconv = zip->sconv;
	else
		sconv = zip->sconv_default;

	if (archive_entry_copy_pathname_l(entry,
	    h, filename_length, sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted "
		    "from %s to current locale.",
		    archive_string_conversion_charset_name(sconv));
		ret = ARCHIVE_WARN;
	}
	__archive_read_consume(a, filename_length);

	/* Read the extra data. */
	if ((h = __archive_read_ahead(a, extra_length, NULL)) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file header");
		return (ARCHIVE_FATAL);
	}

	if (ARCHIVE_OK != process_extra(a, h, extra_length, zip_entry)) {
		return ARCHIVE_FATAL;
	}
	__archive_read_consume(a, extra_length);

	/* Work around a bug in Info-Zip: When reading from a pipe, it
	 * stats the pipe instead of synthesizing a file entry. */
	if ((zip_entry->mode & AE_IFMT) == AE_IFIFO) {
		zip_entry->mode &= ~ AE_IFMT;
		zip_entry->mode |= AE_IFREG;
	}

	/* If the mode is totally empty, set some sane default. */
	if (zip_entry->mode == 0) {
		zip_entry->mode |= 0664;
	}

	/* Windows archivers sometimes use backslash as the directory separator.
	   Normalize to slash. */
	if (zip_entry->system == 0 &&
	    (wp = archive_entry_pathname_w(entry)) != NULL) {
		if (wcschr(wp, L'/') == NULL && wcschr(wp, L'\\') != NULL) {
			size_t i;
			struct archive_wstring s;
			archive_string_init(&s);
			archive_wstrcpy(&s, wp);
			for (i = 0; i < archive_strlen(&s); i++) {
				if (s.s[i] == '\\')
					s.s[i] = '/';
			}
			archive_entry_copy_pathname_w(entry, s.s);
			archive_wstring_free(&s);
		}
	}

	/* Make sure that entries with a trailing '/' are marked as directories
	 * even if the External File Attributes contains bogus values.  If this
	 * is not a directory and there is no type, assume regularfile. */
	if ((zip_entry->mode & AE_IFMT) != AE_IFDIR) {
		int has_slash;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL) {
			len = wcslen(wp);
			has_slash = len > 0 && wp[len - 1] == L'/';
		} else {
			cp = archive_entry_pathname(entry);
			len = (cp != NULL)?strlen(cp):0;
			has_slash = len > 0 && cp[len - 1] == '/';
		}
		/* Correct file type as needed. */
		if (has_slash) {
			zip_entry->mode &= ~AE_IFMT;
			zip_entry->mode |= AE_IFDIR;
			zip_entry->mode |= 0111;
		} else if ((zip_entry->mode & AE_IFMT) == 0) {
			zip_entry->mode |= AE_IFREG;
		}
	}

	/* Make sure directories end in '/' */
	if ((zip_entry->mode & AE_IFMT) == AE_IFDIR) {
		wp = archive_entry_pathname_w(entry);
		if (wp != NULL) {
			len = wcslen(wp);
			if (len > 0 && wp[len - 1] != L'/') {
				struct archive_wstring s;
				archive_string_init(&s);
				archive_wstrcat(&s, wp);
				archive_wstrappend_wchar(&s, L'/');
				archive_entry_copy_pathname_w(entry, s.s);
				archive_wstring_free(&s);
			}
		} else {
			cp = archive_entry_pathname(entry);
			len = (cp != NULL)?strlen(cp):0;
			if (len > 0 && cp[len - 1] != '/') {
				struct archive_string s;
				archive_string_init(&s);
				archive_strcat(&s, cp);
				archive_strappend_char(&s, '/');
				archive_entry_set_pathname(entry, s.s);
				archive_string_free(&s);
			}
		}
	}

	if (zip_entry->flags & LA_FROM_CENTRAL_DIRECTORY) {
		/* If this came from the central dir, it's size info
		 * is definitive, so ignore the length-at-end flag. */
		zip_entry->zip_flags &= ~ZIP_LENGTH_AT_END;
		/* If local header is missing a value, use the one from
		   the central directory.  If both have it, warn about
		   mismatches. */
		if (zip_entry->crc32 == 0) {
			zip_entry->crc32 = zip_entry_central_dir.crc32;
		} else if (!zip->ignore_crc32
		    && zip_entry->crc32 != zip_entry_central_dir.crc32) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent CRC32 values");
			ret = ARCHIVE_WARN;
		}
		if (zip_entry->compressed_size == 0) {
			zip_entry->compressed_size
			    = zip_entry_central_dir.compressed_size;
		} else if (zip_entry->compressed_size
		    != zip_entry_central_dir.compressed_size) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent compressed size: "
			    "%jd in central directory, %jd in local header",
			    (intmax_t)zip_entry_central_dir.compressed_size,
			    (intmax_t)zip_entry->compressed_size);
			ret = ARCHIVE_WARN;
		}
		if (zip_entry->uncompressed_size == 0) {
			zip_entry->uncompressed_size
			    = zip_entry_central_dir.uncompressed_size;
		} else if (zip_entry->uncompressed_size
		    != zip_entry_central_dir.uncompressed_size) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Inconsistent uncompressed size: "
			    "%jd in central directory, %jd in local header",
			    (intmax_t)zip_entry_central_dir.uncompressed_size,
			    (intmax_t)zip_entry->uncompressed_size);
			ret = ARCHIVE_WARN;
		}
	}

	/* Populate some additional entry fields: */
	archive_entry_set_mode(entry, zip_entry->mode);
	archive_entry_set_uid(entry, zip_entry->uid);
	archive_entry_set_gid(entry, zip_entry->gid);
	archive_entry_set_mtime(entry, zip_entry->mtime, 0);
	archive_entry_set_ctime(entry, zip_entry->ctime, 0);
	archive_entry_set_atime(entry, zip_entry->atime, 0);

	if ((zip->entry->mode & AE_IFMT) == AE_IFLNK) {
		size_t linkname_length;

		if (zip_entry->compressed_size > 64 * 1024) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Zip file with oversized link entry");
			return ARCHIVE_FATAL;
		}

		linkname_length = (size_t)zip_entry->compressed_size;

		archive_entry_set_size(entry, 0);
		p = __archive_read_ahead(a, linkname_length, NULL);
		if (p == NULL) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Truncated Zip file");
			return ARCHIVE_FATAL;
		}

		sconv = zip->sconv;
		if (sconv == NULL && (zip->entry->zip_flags & ZIP_UTF8_NAME))
			sconv = zip->sconv_utf8;
		if (sconv == NULL)
			sconv = zip->sconv_default;
		if (archive_entry_copy_symlink_l(entry, p, linkname_length,
		    sconv) != 0) {
			if (errno != ENOMEM && sconv == zip->sconv_utf8 &&
			    (zip->entry->zip_flags & ZIP_UTF8_NAME))
			    archive_entry_copy_symlink_l(entry, p,
				linkname_length, NULL);
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Symlink");
				return (ARCHIVE_FATAL);
			}
			/*
			 * Since there is no character-set regulation for
			 * symlink name, do not report the conversion error
			 * in an automatic conversion.
			 */
			if (sconv != zip->sconv_utf8 ||
			    (zip->entry->zip_flags & ZIP_UTF8_NAME) == 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Symlink cannot be converted "
				    "from %s to current locale.",
				    archive_string_conversion_charset_name(
					sconv));
				ret = ARCHIVE_WARN;
			}
		}
		zip_entry->uncompressed_size = zip_entry->compressed_size = 0;

		if (__archive_read_consume(a, linkname_length) < 0) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Read error skipping symlink target name");
			return ARCHIVE_FATAL;
		}
	} else if (0 == (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
	    || zip_entry->uncompressed_size > 0) {
		/* Set the size only if it's meaningful. */
		archive_entry_set_size(entry, zip_entry->uncompressed_size);
	}
	zip->entry_bytes_remaining = zip_entry->compressed_size;

	/* If there's no body, force read_data() to return EOF immediately. */
	if (0 == (zip_entry->zip_flags & ZIP_LENGTH_AT_END)
	    && zip->entry_bytes_remaining < 1)
		zip->end_of_entry = 1;

	/* Set up a more descriptive format name. */
        archive_string_empty(&zip->format_name);
	archive_string_sprintf(&zip->format_name, "ZIP %d.%d (%s)",
	    version / 10, version % 10,
	    compression_name(zip->entry->compression));
	a->archive.archive_format_name = zip->format_name.s;

	return (ret);
}